

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.cpp
# Opt level: O1

char * set_mname(MonsterThing *tp)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  
  bVar1 = see_monst(tp);
  if ((bVar1) || ((player.flags._1_1_ & 0x40) != 0)) {
    if ((player.flags._1_1_ & 8) == 0) {
      lVar5 = (long)tp->type + -0x41;
    }
    else {
      iVar2 = getMapDisplay((tp->pos).x,(tp->pos).y);
      iVar3 = isupper(iVar2);
      if (iVar3 == 0) {
        iVar2 = rnd(0x1a);
      }
      else {
        iVar2 = iVar2 + -0x41;
      }
      lVar5 = (long)iVar2;
    }
    strcpy(set_mname::tbuf + 4,monsters[lVar5].m_name);
    pcVar4 = set_mname::tbuf;
  }
  else {
    pcVar4 = "something";
    if (terse != false) {
      pcVar4 = "it";
    }
  }
  return pcVar4;
}

Assistant:

const char* set_mname(MonsterThing *tp)
{
    int ch;
    const char *mname;
    static char tbuf[MAXSTR] = { 't', 'h', 'e', ' ' };

    if (!see_monst(tp) && !on(player, SEEMONST))
        return (terse ? "it" : "something");
    else if (on(player, ISHALU))
    {
        ch = getMapDisplay(tp->pos.x, tp->pos.y);
        if (!isupper(ch))
            ch = rnd(26);
        else
            ch -= 'A';
        mname = monsters[ch].m_name;
    }
    else
        mname = monsters[tp->type - 'A'].m_name;
    strcpy(&tbuf[4], mname);
    return tbuf;
}